

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O1

void __thiscall QSizeGripPrivate::updateTopLevelWidget(QSizeGripPrivate *this)

{
  QObject *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QObject *pQVar4;
  
  pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  while (((pQVar1 != (QObject *)0x0 && ((*(uint *)(*(long *)(pQVar1 + 0x20) + 0xc) & 1) == 0)) &&
         ((*(uint *)(*(long *)(pQVar1 + 0x20) + 0xc) & 0xff) != 0x12))) {
    pQVar1 = *(QObject **)(*(long *)(pQVar1 + 8) + 0x10);
  }
  pDVar3 = (this->tlw).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->tlw).wp.value;
  }
  if (pQVar4 != pQVar1) {
    if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
       ((this->tlw).wp.value != (QObject *)0x0)) {
      QObject::removeEventFilter((this->tlw).wp.value);
    }
    if (pQVar1 == (QObject *)0x0) {
      pDVar3 = (Data *)0x0;
    }
    else {
      pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar1);
    }
    pDVar2 = (this->tlw).wp.d;
    (this->tlw).wp.d = pDVar3;
    (this->tlw).wp.value = pQVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
    pDVar3 = (this->tlw).wp.d;
    if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
       ((this->tlw).wp.value != (QObject *)0x0)) {
      QObject::installEventFilter((this->tlw).wp.value);
      return;
    }
  }
  return;
}

Assistant:

void updateTopLevelWidget()
    {
        Q_Q(QSizeGrip);
        QWidget *w = qt_sizegrip_topLevelWidget(q);
        if (tlw == w)
            return;
        if (tlw)
            tlw->removeEventFilter(q);
        tlw = w;
        if (tlw)
            tlw->installEventFilter(q);
    }